

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5StructurePromote(Fts5Index *p,int iLvl,Fts5Structure *pStruct)

{
  int *piVar1;
  u64 *puVar2;
  undefined8 *puVar3;
  Fts5StructureSegment *pFVar4;
  Fts5StructureSegment *pFVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  u64 uVar8;
  u64 uVar9;
  u64 uVar10;
  Fts5StructureSegment **ppFVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  Fts5StructureSegment **ppFVar16;
  long lVar17;
  long in_R8;
  int iVar18;
  long local_50;
  
  if (p->rc != 0) {
    return;
  }
  lVar14 = (long)pStruct->aLevel[iLvl].nSeg;
  if (lVar14 != 0) {
    pFVar4 = pStruct->aLevel[iLvl].aSeg;
    iVar12 = (pFVar4[lVar14 + -1].pgnoLast - pFVar4[lVar14 + -1].pgnoFirst) + 1;
    ppFVar11 = &pStruct->aLevel[(uint)iLvl].aSeg;
    iVar13 = iLvl;
    do {
      ppFVar16 = ppFVar11;
      if (iVar13 < 1) {
        iVar13 = -1;
        iVar15 = 0;
        goto LAB_001e956a;
      }
      iVar13 = iVar13 + -1;
      ppFVar11 = ppFVar16 + -2;
    } while (*(int *)((long)ppFVar16 + -0x14) == 0);
    in_R8 = (long)*(int *)((long)ppFVar16 + -0x14);
    iVar15 = 0;
    if (0 < in_R8) {
      pFVar4 = ppFVar16[-2];
      lVar14 = in_R8 * 0x38;
      in_R8 = 0;
      iVar15 = 0;
      do {
        iVar18 = *(int *)((long)&pFVar4->pgnoLast + in_R8) -
                 *(int *)((long)&pFVar4->pgnoFirst + in_R8);
        if (iVar15 <= iVar18) {
          iVar15 = iVar18 + 1;
        }
        in_R8 = in_R8 + 0x38;
      } while (lVar14 - in_R8 != 0);
    }
    if (iVar15 < iVar12) {
      iVar13 = -1;
      iVar15 = 0;
    }
LAB_001e956a:
    if (-1 < iVar13) {
      iLvl = iVar13;
      iVar12 = iVar15;
    }
    if ((pStruct->aLevel[iLvl].nMerge == 0) && (iLvl + 1 < pStruct->nLevel)) {
      local_50 = (long)(iLvl + 1);
      while (pStruct->aLevel[local_50].nMerge == 0) {
        lVar14 = (long)pStruct->aLevel[local_50].nSeg;
        if (0 < lVar14) {
          lVar17 = lVar14 * 0x38;
          lVar14 = lVar14 + 1;
          do {
            pFVar4 = pStruct->aLevel[local_50].aSeg;
            if (iVar12 < (*(int *)((long)pFVar4 + lVar17 + -0x30) -
                         *(int *)((long)pFVar4 + lVar17 + -0x34)) + 1) {
              return;
            }
            fts5StructureExtendLevel(&p->rc,pStruct,iLvl,1,(int)in_R8);
            if (p->rc != 0) {
              return;
            }
            pFVar4 = pStruct->aLevel[iLvl].aSeg;
            pFVar5 = pStruct->aLevel[local_50].aSeg;
            pFVar4->nEntry = *(u64 *)(lVar17 + -8 + (long)pFVar5);
            puVar3 = (undefined8 *)((long)&pFVar5[-1].iSegid + lVar17);
            uVar6 = *puVar3;
            uVar7 = puVar3[1];
            puVar2 = (u64 *)(lVar17 + -0x28 + (long)pFVar5);
            uVar8 = *puVar2;
            uVar9 = puVar2[1];
            puVar3 = (undefined8 *)(lVar17 + -0x18 + (long)pFVar5);
            uVar10 = puVar3[1];
            *(undefined8 *)&pFVar4->nPgTombstone = *puVar3;
            pFVar4->nEntryTombstone = uVar10;
            pFVar4->iOrigin1 = uVar8;
            pFVar4->iOrigin2 = uVar9;
            pFVar4->iSegid = (int)uVar6;
            pFVar4->pgnoFirst = (int)((ulong)uVar6 >> 0x20);
            *(undefined8 *)&pFVar4->pgnoLast = uVar7;
            piVar1 = &pStruct->aLevel[iLvl].nSeg;
            *piVar1 = *piVar1 + 1;
            piVar1 = &pStruct->aLevel[local_50].nSeg;
            *piVar1 = *piVar1 + -1;
            lVar14 = lVar14 + -1;
            lVar17 = lVar17 + -0x38;
          } while (1 < lVar14);
        }
        local_50 = local_50 + 1;
        if (pStruct->nLevel <= local_50) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void fts5StructurePromote(
  Fts5Index *p,                   /* FTS5 backend object */
  int iLvl,                       /* Index level just updated */
  Fts5Structure *pStruct          /* Index structure */
){
  if( p->rc==SQLITE_OK ){
    int iTst;
    int iPromote = -1;
    int szPromote = 0;            /* Promote anything this size or smaller */
    Fts5StructureSegment *pSeg;   /* Segment just written */
    int szSeg;                    /* Size of segment just written */
    int nSeg = pStruct->aLevel[iLvl].nSeg;

    if( nSeg==0 ) return;
    pSeg = &pStruct->aLevel[iLvl].aSeg[pStruct->aLevel[iLvl].nSeg-1];
    szSeg = (1 + pSeg->pgnoLast - pSeg->pgnoFirst);

    /* Check for condition (a) */
    for(iTst=iLvl-1; iTst>=0 && pStruct->aLevel[iTst].nSeg==0; iTst--);
    if( iTst>=0 ){
      int i;
      int szMax = 0;
      Fts5StructureLevel *pTst = &pStruct->aLevel[iTst];
      assert( pTst->nMerge==0 );
      for(i=0; i<pTst->nSeg; i++){
        int sz = pTst->aSeg[i].pgnoLast - pTst->aSeg[i].pgnoFirst + 1;
        if( sz>szMax ) szMax = sz;
      }
      if( szMax>=szSeg ){
        /* Condition (a) is true. Promote the newest segment on level
        ** iLvl to level iTst.  */
        iPromote = iTst;
        szPromote = szMax;
      }
    }

    /* If condition (a) is not met, assume (b) is true. StructurePromoteTo()
    ** is a no-op if it is not.  */
    if( iPromote<0 ){
      iPromote = iLvl;
      szPromote = szSeg;
    }
    fts5StructurePromoteTo(p, iPromote, szPromote, pStruct);
  }
}